

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjtalk.c
# Opt level: O0

_Bool Open_JTalk_synthesis(Open_JTalk *open_jtalk,char *txt,FILE *wavfp,FILE *logfp)

{
  HTS_Boolean HVar1;
  int iVar2;
  NJD *njd;
  long in_RCX;
  long in_RDX;
  Mecab *in_RDI;
  NJD *in_stack_00000008;
  JPCommon *in_stack_00000010;
  char buff [1024];
  _Bool result;
  JPCommon *in_stack_fffffffffffffba8;
  FILE *fp;
  HTS_Engine *in_stack_fffffffffffffbb0;
  Mecab *feature;
  char *in_stack_fffffffffffffbc8;
  char *in_stack_fffffffffffffbd0;
  JPCommon *in_stack_fffffffffffffbe0;
  FILE *in_stack_fffffffffffffbf8;
  HTS_Engine *in_stack_fffffffffffffc00;
  FILE *in_stack_fffffffffffffc08;
  HTS_Engine *in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc20;
  Mecab *in_stack_fffffffffffffc28;
  FILE *in_stack_fffffffffffffd68;
  HTS_Engine *in_stack_fffffffffffffd70;
  _Bool local_1;
  
  if (in_RDI == (Mecab *)0x0) {
    local_1 = false;
  }
  else {
    local_1 = false;
    text2mecab(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    Mecab_analysis(in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
    feature = in_RDI + 1;
    njd = (NJD *)Mecab_get_feature(in_RDI);
    Mecab_get_size(in_RDI);
    mecab2njd(njd,(char **)feature,(int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
    njd_set_pronunciation((NJD *)in_stack_fffffffffffffc00);
    njd_set_digit((NJD *)in_stack_fffffffffffffbe0);
    njd_set_accent_phrase((NJD *)in_stack_fffffffffffffbb0);
    njd_set_accent_type((NJD *)buff._0_8_);
    njd_set_unvoiced_vowel((NJD *)buff._16_8_);
    njd_set_long_vowel((NJD *)(in_RDI + 1));
    njd2jpcommon(in_stack_00000010,in_stack_00000008);
    JPCommon_make_label(in_stack_fffffffffffffbe0);
    iVar2 = JPCommon_get_label_size(in_stack_fffffffffffffba8);
    if (2 < iVar2) {
      fp = (FILE *)(in_RDI + 2);
      in_stack_fffffffffffffbb0 = (HTS_Engine *)JPCommon_get_label_feature((JPCommon *)fp);
      JPCommon_get_label_size((JPCommon *)fp);
      HVar1 = HTS_Engine_synthesize_from_strings(in_stack_fffffffffffffbb0,(char **)fp,0x19e432);
      local_1 = HVar1 == '\x01';
      if (in_RDX != 0) {
        HTS_Engine_save_riff(in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
      }
      if (in_RCX != 0) {
        NJD_fprint((NJD *)in_stack_fffffffffffffbb0,fp);
        HTS_Engine_save_label(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
        HTS_Engine_save_information(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      }
      HTS_Engine_refresh((HTS_Engine *)0x19e4cd);
    }
    JPCommon_refresh((JPCommon *)0x19e4de);
    NJD_refresh((NJD *)0x19e4ef);
    Mecab_refresh((Mecab *)in_stack_fffffffffffffbb0);
  }
  return local_1;
}

Assistant:

bool Open_JTalk_synthesis(Open_JTalk *open_jtalk, const char *txt, FILE *wavfp, FILE *logfp)
{
	if (open_jtalk == NULL)
	{
		return false;
	}
	bool result = false;
	char buff[MAXBUFLEN];

	text2mecab(buff, txt);
	Mecab_analysis(&open_jtalk->mecab, buff);
	mecab2njd(&open_jtalk->njd, Mecab_get_feature(&open_jtalk->mecab),
			  Mecab_get_size(&open_jtalk->mecab));
	njd_set_pronunciation(&open_jtalk->njd);
	njd_set_digit(&open_jtalk->njd);
	njd_set_accent_phrase(&open_jtalk->njd);
	njd_set_accent_type(&open_jtalk->njd);
	njd_set_unvoiced_vowel(&open_jtalk->njd);
	njd_set_long_vowel(&open_jtalk->njd);
	njd2jpcommon(&open_jtalk->jpcommon, &open_jtalk->njd);
	JPCommon_make_label(&open_jtalk->jpcommon);
	if (JPCommon_get_label_size(&open_jtalk->jpcommon) > 2)
	{
		if (HTS_Engine_synthesize_from_strings(&open_jtalk->engine, JPCommon_get_label_feature(&open_jtalk->jpcommon),
											   JPCommon_get_label_size(&open_jtalk->jpcommon)) == true)
			result = true;
		if (wavfp != NULL)
			HTS_Engine_save_riff(&open_jtalk->engine, wavfp);
		if (logfp != NULL)
		{
			NJD_fprint(&open_jtalk->njd, logfp);
			HTS_Engine_save_label(&open_jtalk->engine, logfp);
			HTS_Engine_save_information(&open_jtalk->engine, logfp);
		}
		HTS_Engine_refresh(&open_jtalk->engine);
	}
	JPCommon_refresh(&open_jtalk->jpcommon);
	NJD_refresh(&open_jtalk->njd);
	Mecab_refresh(&open_jtalk->mecab);

	return result;
}